

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::PromiseClient::promiseResolvedToThis
          (PromiseClient *this,bool receivedCall)

{
  bool bVar1;
  byte local_39;
  Fault local_20;
  Fault f;
  DebugExpression<bool> _kjCondition;
  bool receivedCall_local;
  PromiseClient *this_local;
  
  f.exception._5_1_ = (this->isResolved ^ 0xffU) & 1;
  f.exception._7_1_ = receivedCall;
  f.exception._6_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 5));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 6))
  ;
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[167]>
              (&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
               ,0x503,FAILED,"!isResolved",
               "_kjCondition,\"peer committed RPC protocol error: a promise cannot resolve to another promise \" \"where the latter promise is itself already resolved; see \" \"`CapDescriptor.senderPromise`.\""
               ,(DebugExpression<bool> *)((long)&f.exception + 6),
               (char (*) [167])
               "peer committed RPC protocol error: a promise cannot resolve to another promise where the latter promise is itself already resolved; see `CapDescriptor.senderPromise`."
              );
    kj::_::Debug::Fault::fatal(&local_20);
  }
  local_39 = 1;
  if ((this->receivedCall & 1U) == 0) {
    local_39 = f.exception._7_1_;
  }
  this->receivedCall = (bool)(local_39 & 1);
  return;
}

Assistant:

void promiseResolvedToThis(bool receivedCall) override {
      // Some other promise resolved to *this* promise.
      KJ_REQUIRE(!isResolved,
          "peer committed RPC protocol error: a promise cannot resolve to another promise "
          "where the latter promise is itself already resolved; see "
          "`CapDescriptor.senderPromise`.");
      this->receivedCall = this->receivedCall || receivedCall;
    }